

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.hpp
# Opt level: O0

void __thiscall
hta::storage::file::Exception::Exception
          (Exception *this,string *message,path *filename,int error_number)

{
  char *__rhs;
  string_type local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  int local_24;
  path *ppStack_20;
  int error_number_local;
  path *filename_local;
  string *message_local;
  Exception *this_local;
  
  local_24 = error_number;
  ppStack_20 = filename;
  filename_local = (path *)message;
  message_local = (string *)this;
  std::operator+(&local_a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)message,": ");
  std::filesystem::__cxx11::path::operator_cast_to_string(&local_c8,ppStack_20);
  std::operator+(&local_88,&local_a8,&local_c8);
  std::operator+(&local_68,&local_88,": ");
  __rhs = strerror(local_24);
  std::operator+(&local_48,&local_68,__rhs);
  hta::Exception::Exception(&this->super_Exception,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_a8);
  *(undefined ***)&this->super_Exception = &PTR__Exception_00296c48;
  Catch::clara::std::filesystem::__cxx11::path::path((path *)&this->filename_,(path *)ppStack_20);
  this->errno_ = local_24;
  return;
}

Assistant:

Exception(const std::string& message, const std::filesystem::path& filename, int error_number)
    : hta::Exception(message + ": " + std::string(filename) + ": " + std::strerror(error_number)),
      filename_(filename), errno_(error_number)
    {
    }